

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O2

int Cudd_CheckKeys(DdManager *table)

{
  uint uVar1;
  DdSubtable *pDVar2;
  DdNode **ppDVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  DdManager *pDVar7;
  int iVar8;
  DdNode *pDVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  int local_58;
  int local_54;
  int local_4c;
  
  uVar10 = (ulong)(uint)table->size;
  if (table->size < 1) {
    uVar10 = 0;
  }
  local_58 = 0;
  local_4c = 0;
  local_54 = 0;
  iVar12 = 0;
  iVar8 = 0;
  for (uVar14 = 0; uVar14 != uVar10; uVar14 = uVar14 + 1) {
    pDVar2 = table->subtables;
    ppDVar3 = pDVar2[uVar14].nodelist;
    uVar11 = pDVar2[uVar14].keys;
    uVar15 = pDVar2[uVar14].shift;
    uVar1 = pDVar2[uVar14].dead;
    uVar13 = pDVar2[uVar14].slots;
    if ((uVar13 & ~(-1 << (-(char)uVar15 & 0x1fU))) != 0) {
      fprintf((FILE *)table->err,"Unique table %d is not the right power of 2\n",uVar14);
      fprintf((FILE *)table->err,"    slots = %u shift = %d\n",(ulong)uVar13,(ulong)uVar15);
    }
    local_4c = local_4c + uVar11;
    local_54 = local_54 + uVar13;
    uVar15 = uVar1;
    for (uVar4 = 0; uVar4 != uVar13; uVar4 = uVar4 + 1) {
      pDVar7 = (DdManager *)ppDVar3[uVar4];
      bVar16 = pDVar7 != table;
      for (; pDVar7 != table; pDVar7 = (DdManager *)(pDVar7->sentinel).next) {
        uVar11 = uVar11 - 1;
        uVar15 = uVar15 - ((pDVar7->sentinel).ref == 0);
      }
      iVar8 = iVar8 + (uint)bVar16;
    }
    if (uVar11 != 0) {
      fprintf((FILE *)table->err,"Wrong number of keys found in unique table %d (difference=%d)\n",
              uVar14 & 0xffffffff,(ulong)uVar11);
      local_58 = local_58 + 1;
    }
    if (uVar15 != 0) {
      fprintf((FILE *)table->err,
              "Wrong number of dead found in unique table no. %d (difference=%d)\n",
              uVar14 & 0xffffffff,(ulong)uVar15);
    }
    iVar12 = iVar12 + uVar1;
  }
  uVar11 = table->sizeZ;
  if (table->sizeZ < 1) {
    uVar11 = 0;
  }
  for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
    pDVar2 = table->subtableZ;
    uVar15 = pDVar2[uVar10].keys;
    uVar1 = pDVar2[uVar10].dead;
    local_54 = local_54 + pDVar2[uVar10].slots;
    uVar13 = uVar1;
    uVar5 = uVar15;
    for (uVar14 = 0; uVar14 != pDVar2[uVar10].slots; uVar14 = uVar14 + 1) {
      pDVar9 = pDVar2[uVar10].nodelist[uVar14];
      bVar16 = pDVar9 != (DdNode *)0x0;
      for (; pDVar9 != (DdNode *)0x0; pDVar9 = pDVar9->next) {
        uVar5 = uVar5 - 1;
        uVar13 = uVar13 - (pDVar9->ref == 0);
      }
      iVar8 = iVar8 + (uint)bVar16;
    }
    if (uVar5 != 0) {
      fprintf((FILE *)table->err,
              "Wrong number of keys found in ZDD unique table no. %d (difference=%d)\n",
              uVar10 & 0xffffffff);
      local_58 = local_58 + 1;
    }
    if (uVar13 != 0) {
      fprintf((FILE *)table->err,
              "Wrong number of dead found in ZDD unique table no. %d (difference=%d)\n",
              uVar10 & 0xffffffff,(ulong)uVar13);
    }
    local_4c = local_4c + uVar15;
    iVar12 = iVar12 + uVar1;
  }
  uVar15 = (table->constants).keys;
  uVar1 = (table->constants).dead;
  uVar13 = (table->constants).slots;
  uVar11 = local_54 + uVar13;
  uVar5 = uVar1;
  uVar6 = uVar15;
  for (uVar10 = 0; uVar10 != uVar13; uVar10 = uVar10 + 1) {
    pDVar9 = (table->constants).nodelist[uVar10];
    bVar16 = pDVar9 != (DdNode *)0x0;
    for (; pDVar9 != (DdNode *)0x0; pDVar9 = pDVar9->next) {
      uVar6 = uVar6 - 1;
      uVar5 = uVar5 - (pDVar9->ref == 0);
    }
    iVar8 = iVar8 + (uint)bVar16;
  }
  if (uVar6 != 0) {
    fprintf((FILE *)table->err,"Wrong number of keys found in the constant table (difference=%d)\n")
    ;
    local_58 = local_58 + 1;
  }
  local_4c = uVar15 + local_4c;
  if (uVar5 != 0) {
    fprintf((FILE *)table->err,"Wrong number of dead found in the constant table (difference=%d)\n",
            (ulong)uVar5);
  }
  if (local_4c != table->keysZ + table->keys) {
    fprintf((FILE *)table->err,"Wrong number of total keys found (difference=%d)\n",
            (ulong)(local_4c - table->keys));
  }
  if (uVar11 != table->slots) {
    fprintf((FILE *)table->err,"Wrong number of total slots found (difference=%d)\n");
    uVar11 = table->slots;
  }
  iVar12 = uVar1 + iVar12;
  if (table->minDead != (uint)(long)((double)uVar11 * table->gcFrac)) {
    fprintf((FILE *)table->err,"Wrong number of minimum dead found (%u vs. %u)\n");
  }
  if (iVar12 != table->deadZ + table->dead) {
    fprintf((FILE *)table->err,"Wrong number of total dead found (difference=%d)\n",
            (ulong)(iVar12 - table->dead));
  }
  printf("Average length of non-empty lists = %g\n",(double)table->keys / (double)iVar8);
  return local_58;
}

Assistant:

int
Cudd_CheckKeys(
  DdManager * table)
{
    int size;
    int i,j;
    DdNodePtr *nodelist;
    DdNode *node;
    DdNode *sentinel = &(table->sentinel);
    DdSubtable *subtable;
    int keys;
    int dead;
    int count = 0;
    int totalKeys = 0;
    int totalSlots = 0;
    int totalDead = 0;
    int nonEmpty = 0;
    unsigned int slots;
    int logSlots;
    int shift;

    size = table->size;

    for (i = 0; i < size; i++) {
        subtable = &(table->subtables[i]);
        nodelist = subtable->nodelist;
        keys = subtable->keys;
        dead = subtable->dead;
        totalKeys += keys;
        slots = subtable->slots;
        shift = subtable->shift;
        logSlots = sizeof(int) * 8 - shift;
        if (((slots >> logSlots) << logSlots) != slots) {
            (void) fprintf(table->err,
                           "Unique table %d is not the right power of 2\n", i);
            (void) fprintf(table->err,
                           "    slots = %u shift = %d\n", slots, shift);
        }
        totalSlots += slots;
        totalDead += dead;
        for (j = 0; (unsigned) j < slots; j++) {
            node = nodelist[j];
            if (node != sentinel) {
                nonEmpty++;
            }
            while (node != sentinel) {
                keys--;
                if (node->ref == 0) {
                    dead--;
                }
                node = node->next;
            }
        }
        if (keys != 0) {
            (void) fprintf(table->err, "Wrong number of keys found \
in unique table %d (difference=%d)\n", i, keys);
            count++;
        }
        if (dead != 0) {
            (void) fprintf(table->err, "Wrong number of dead found \
in unique table no. %d (difference=%d)\n", i, dead);
        }
    }   /* for each BDD/ADD subtable */

    /* Check the ZDD subtables. */
    size = table->sizeZ;

    for (i = 0; i < size; i++) {
        subtable = &(table->subtableZ[i]);
        nodelist = subtable->nodelist;
        keys = subtable->keys;
        dead = subtable->dead;
        totalKeys += keys;
        totalSlots += subtable->slots;
        totalDead += dead;
        for (j = 0; (unsigned) j < subtable->slots; j++) {
            node = nodelist[j];
            if (node != NULL) {
                nonEmpty++;
            }
            while (node != NULL) {
                keys--;
                if (node->ref == 0) {
                    dead--;
                }
                node = node->next;
            }
        }
        if (keys != 0) {
            (void) fprintf(table->err, "Wrong number of keys found \
in ZDD unique table no. %d (difference=%d)\n", i, keys);
            count++;
        }
        if (dead != 0) {
            (void) fprintf(table->err, "Wrong number of dead found \
in ZDD unique table no. %d (difference=%d)\n", i, dead);
        }
    }   /* for each ZDD subtable */

    /* Check the constant table. */
    subtable = &(table->constants);
    nodelist = subtable->nodelist;
    keys = subtable->keys;
    dead = subtable->dead;
    totalKeys += keys;
    totalSlots += subtable->slots;
    totalDead += dead;
    for (j = 0; (unsigned) j < subtable->slots; j++) {
        node = nodelist[j];
        if (node != NULL) {
            nonEmpty++;
        }
        while (node != NULL) {
            keys--;
            if (node->ref == 0) {
                dead--;
            }
            node = node->next;
        }
    }
    if (keys != 0) {
        (void) fprintf(table->err, "Wrong number of keys found \
in the constant table (difference=%d)\n", keys);
        count++;
    }
    if (dead != 0) {
        (void) fprintf(table->err, "Wrong number of dead found \
in the constant table (difference=%d)\n", dead);
    }
    if ((unsigned) totalKeys != table->keys + table->keysZ) {
        (void) fprintf(table->err, "Wrong number of total keys found \
(difference=%d)\n", (int) (totalKeys-table->keys));
    }
    if ((unsigned) totalSlots != table->slots) {
        (void) fprintf(table->err, "Wrong number of total slots found \
(difference=%d)\n", (int) (totalSlots-table->slots));
    }
    if (table->minDead != (unsigned) (table->gcFrac * table->slots)) {
        (void) fprintf(table->err, "Wrong number of minimum dead found \
(%u vs. %u)\n", table->minDead,
        (unsigned) (table->gcFrac * (double) table->slots));
    }
    if ((unsigned) totalDead != table->dead + table->deadZ) {
        (void) fprintf(table->err, "Wrong number of total dead found \
(difference=%d)\n", (int) (totalDead-table->dead));
    }
    (void)printf("Average length of non-empty lists = %g\n",
    (double) table->keys / (double) nonEmpty);

    return(count);

}